

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::RootNode::getPath(RootNode *this,char *path,int pathlen)

{
  int iVar1;
  char *__dest;
  char *pcStack_30;
  char ret;
  char *s;
  int pathlen_local;
  char *path_local;
  RootNode *this_local;
  
  if (this->filename_ == (char *)0x0) {
    this_local._7_1_ = '\x01';
  }
  else {
    fl_strlcpy(path,this->filename_,(long)pathlen);
    for (pcStack_30 = path; *pcStack_30 != '\0'; pcStack_30 = pcStack_30 + 1) {
      if (*pcStack_30 == '\\') {
        *pcStack_30 = '/';
      }
    }
    __dest = strrchr(path,0x2e);
    if (__dest == (char *)0x0) {
      this_local._7_1_ = '\0';
    }
    else {
      *__dest = '\0';
      this_local._7_1_ = fl_make_path(path);
      iVar1 = strncmp(path,"/etc/fltk/",10);
      if (iVar1 == 0) {
        fl_chmod(path,0x1ed);
      }
      strcpy(__dest,"/");
    }
  }
  return this_local._7_1_;
}

Assistant:

char Fl_Preferences::RootNode::getPath( char *path, int pathlen ) {
  if (!filename_)   // RUNTIME preferences
    return 1; // return 1 (not -1) to be consistent with fl_make_path()
  strlcpy( path, filename_, pathlen); 

  char *s;
  for ( s = path; *s; s++ ) if ( *s == '\\' ) *s = '/';
  s = strrchr( path, '.' );
  if ( !s ) return 0;
  *s = 0;
  char ret = fl_make_path( path );
#if !(defined(__APPLE__) || defined(WIN32))
  // unix: make sure that system prefs dir. is user-readable
  if (strncmp(path, "/etc/fltk/", 10) == 0) {
    fl_chmod(path, 0755); // rwxr-xr-x
  }
#endif
  strcpy( s, "/" );
  return ret;
}